

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3d.h
# Opt level: O2

m3dtr_t * m3d_frame(m3d_t *model,M3D_INDEX actionid,M3D_INDEX frameid,m3dtr_t *skeleton)

{
  m3dfr_t *pmVar1;
  ulong uVar2;
  M3D_INDEX *pMVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((((model == (m3d_t *)0x0) || (uVar6 = (ulong)model->numbone, uVar6 == 0)) ||
      (model->bone == (m3db_t *)0x0)) ||
     ((actionid != 0xffffffff &&
      (((model->action == (m3da_t *)0x0 || (model->numaction <= actionid)) ||
       (model->action[actionid].numframe <= frameid)))))) {
    model->errcode = -0x45;
    return skeleton;
  }
  model->errcode = '\0';
  if (skeleton == (m3dtr_t *)0x0) {
    skeleton = (m3dtr_t *)malloc(uVar6 * 0xc);
    if (skeleton == (m3dtr_t *)0x0) {
      model->errcode = -1;
      return (m3dtr_t *)0x0;
    }
  }
  else {
    uVar2 = (ulong)frameid;
    if (actionid != 0xffffffff && frameid != 0) goto LAB_00426c08;
  }
  pMVar3 = &skeleton->ori;
  uVar2 = 0;
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
    ((m3dtr_t *)(pMVar3 + -2))->boneid = (M3D_INDEX)uVar5;
    pMVar3[-1] = *(M3D_INDEX *)((long)model->bone->mat4 + lVar4 + -0x18);
    *pMVar3 = *(M3D_INDEX *)((long)model->bone->mat4 + lVar4 + -0x14);
    uVar6 = (ulong)model->numbone;
    pMVar3 = pMVar3 + 3;
    lVar4 = lVar4 + 0x68;
  }
LAB_00426c08:
  if ((actionid < model->numaction) &&
     ((frameid != 0 || ((model->action[actionid].frame)->msec == 0)))) {
    for (; (uint)uVar2 <= frameid; uVar2 = (ulong)((uint)uVar2 + 1)) {
      pmVar1 = model->action[actionid].frame;
      lVar4 = 0;
      for (uVar6 = 0; uVar6 < pmVar1[uVar2].numtransform; uVar6 = uVar6 + 1) {
        skeleton[*(uint *)((long)&(pmVar1[uVar2].transform)->boneid + lVar4)].pos =
             *(M3D_INDEX *)((long)&(pmVar1[uVar2].transform)->pos + lVar4);
        skeleton[*(uint *)((long)&(pmVar1[uVar2].transform)->boneid + lVar4)].ori =
             *(M3D_INDEX *)((long)&(pmVar1[uVar2].transform)->ori + lVar4);
        lVar4 = lVar4 + 0xc;
      }
    }
  }
  return skeleton;
}

Assistant:

m3dtr_t *m3d_frame(m3d_t *model, M3D_INDEX actionid, M3D_INDEX frameid, m3dtr_t *skeleton)
{
    unsigned int i;
    M3D_INDEX s = frameid;
    m3dfr_t *fr;

    if(!model || !model->numbone || !model->bone || (actionid != M3D_UNDEF && (!model->action ||
        actionid >= model->numaction || frameid >= model->action[actionid].numframe))) {
            model->errcode = M3D_ERR_UNKFRAME;
            return skeleton;
    }
    model->errcode = M3D_SUCCESS;
    if(!skeleton) {
        skeleton = (m3dtr_t*)M3D_MALLOC(model->numbone * sizeof(m3dtr_t));
        if(!skeleton) {
            model->errcode = M3D_ERR_ALLOC;
            return NULL;
        }
        goto gen;
    }
    if(actionid == M3D_UNDEF || !frameid) {
gen:    s = 0;
        for(i = 0; i < model->numbone; i++) {
            skeleton[i].boneid = i;
            skeleton[i].pos = model->bone[i].pos;
            skeleton[i].ori = model->bone[i].ori;
        }
    }
    if(actionid < model->numaction && (frameid || !model->action[actionid].frame[0].msec)) {
        for(; s <= frameid; s++) {
            fr = &model->action[actionid].frame[s];
            for(i = 0; i < fr->numtransform; i++) {
                skeleton[fr->transform[i].boneid].pos = fr->transform[i].pos;
                skeleton[fr->transform[i].boneid].ori = fr->transform[i].ori;
            }
        }
    }
    return skeleton;
}